

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O1

string * __thiscall
inja::Parser::load_file_abi_cxx11_(string *__return_storage_ptr__,Parser *this,string_view filename)

{
  undefined8 uVar1;
  ifstream file;
  undefined1 *local_240 [2];
  undefined1 local_230 [16];
  long local_220 [29];
  undefined8 auStack_138 [36];
  
  local_240[0] = local_230;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_240,filename.data_,filename.data_ + filename.size_);
  std::ifstream::ifstream(local_220,(string *)local_240,_S_in);
  if (local_240[0] != local_230) {
    operator_delete(local_240[0]);
  }
  uVar1 = *(undefined8 *)((long)auStack_138 + *(long *)(local_220[0] + -0x18));
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
            ((string *)__return_storage_ptr__,uVar1,0xffffffff,0,0xffffffff);
  std::ifstream::~ifstream(local_220);
  return __return_storage_ptr__;
}

Assistant:

std::string load_file(nonstd::string_view filename) {
		std::ifstream file(static_cast<std::string>(filename));
		std::string text((std::istreambuf_iterator<char>(file)), std::istreambuf_iterator<char>());
		return text;
	}